

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::time_internal::cctz::anon_unknown_0::Header::Build(Header *this,tzhead *tzh)

{
  size_t sVar1;
  int_fast32_t v;
  tzhead *tzh_local;
  Header *this_local;
  
  sVar1 = Decode32(tzh->tzh_timecnt);
  if ((long)sVar1 < 0) {
    this_local._7_1_ = false;
  }
  else {
    this->timecnt = sVar1;
    sVar1 = Decode32(tzh->tzh_typecnt);
    if ((long)sVar1 < 0) {
      this_local._7_1_ = false;
    }
    else {
      this->typecnt = sVar1;
      sVar1 = Decode32(tzh->tzh_charcnt);
      if ((long)sVar1 < 0) {
        this_local._7_1_ = false;
      }
      else {
        this->charcnt = sVar1;
        sVar1 = Decode32(tzh->tzh_leapcnt);
        if ((long)sVar1 < 0) {
          this_local._7_1_ = false;
        }
        else {
          this->leapcnt = sVar1;
          sVar1 = Decode32(tzh->tzh_ttisstdcnt);
          if ((long)sVar1 < 0) {
            this_local._7_1_ = false;
          }
          else {
            this->ttisstdcnt = sVar1;
            sVar1 = Decode32(tzh->tzh_ttisutcnt);
            if ((long)sVar1 < 0) {
              this_local._7_1_ = false;
            }
            else {
              this->ttisutcnt = sVar1;
              this_local._7_1_ = true;
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Header::Build(const tzhead& tzh) {
  std::int_fast32_t v;
  if ((v = Decode32(tzh.tzh_timecnt)) < 0) return false;
  timecnt = static_cast<std::size_t>(v);
  if ((v = Decode32(tzh.tzh_typecnt)) < 0) return false;
  typecnt = static_cast<std::size_t>(v);
  if ((v = Decode32(tzh.tzh_charcnt)) < 0) return false;
  charcnt = static_cast<std::size_t>(v);
  if ((v = Decode32(tzh.tzh_leapcnt)) < 0) return false;
  leapcnt = static_cast<std::size_t>(v);
  if ((v = Decode32(tzh.tzh_ttisstdcnt)) < 0) return false;
  ttisstdcnt = static_cast<std::size_t>(v);
  if ((v = Decode32(tzh.tzh_ttisutcnt)) < 0) return false;
  ttisutcnt = static_cast<std::size_t>(v);
  return true;
}